

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDebugNames::NameIndex::dumpEntry(NameIndex *this,ScopedPrinter *W,uint64_t *Offset)

{
  undefined8 *puVar1;
  StringRef N;
  undefined1 auVar2 [8];
  undefined1 uVar3;
  char cVar4;
  size_type sVar5;
  long *plVar6;
  _Alloc_hider _Var7;
  Child CVar8;
  Child RHS;
  undefined8 *puVar9;
  undefined1 local_178 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  uint64_t EntryId;
  Error local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  NodeKind local_98;
  char cStack_97;
  undefined6 uStack_96;
  string local_90;
  Child local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  Child local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  Child local_38;
  DictScope EntryScope;
  
  EntryOr._184_8_ = *Offset;
  getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_178,this,Offset);
  uVar3 = EntryOr.field_0.TStorage.buffer[0xb0];
  auVar2 = local_178;
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    Twine::Twine((Twine *)&local_a8,"Entry @ 0x");
    Twine::Twine((Twine *)&local_70,(Child)&EntryOr.field_0xb8,UHexKind,(Child)0x0,EmptyKind);
    if ((local_98 == NullKind) || (local_60 == NullKind)) {
      local_58.twine = (Twine *)0x0;
      uStack_50 = 0;
      local_48 = CONCAT62(local_48._2_6_,0x100);
    }
    else {
      if (local_98 == EmptyKind) {
        local_48 = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
        local_a8.Payload._0_4_ = local_70.decUI;
        local_a8.Payload._4_4_ = local_70._4_4_;
      }
      else {
        if (local_60 != EmptyKind) {
          CVar8._4_4_ = local_a8.Payload._4_4_;
          CVar8.decUI = local_a8.Payload._0_4_;
          if (cStack_97 != '\x01') {
            local_98 = TwineKind;
            CVar8.twine = (Twine *)&local_a8;
          }
          RHS = local_70;
          if (cStack_5f != '\x01') {
            local_60 = TwineKind;
            RHS.twine = (Twine *)&local_70;
          }
          Twine::Twine((Twine *)&local_58,CVar8,local_98,RHS,local_60);
          goto LAB_00d4b8dc;
        }
        local_48 = CONCAT62(uStack_96,CONCAT11(cStack_97,local_98));
        uStack_68 = uStack_a0;
        uStack_64 = uStack_9c;
      }
      local_58._4_4_ = local_a8.Payload._4_4_;
      local_58.decUI = local_a8.Payload._0_4_;
      uStack_50 = CONCAT44(uStack_64,uStack_68);
    }
LAB_00d4b8dc:
    Twine::str_abi_cxx11_(&local_90,(Twine *)&local_58);
    N.Length = local_90._M_string_length;
    N.Data = local_90._M_dataplus._M_p;
    DelimitedScope<'{',_'}'>::DelimitedScope((DelimitedScope<___,____> *)&local_38,W,N);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x272,
                    "storage_type *llvm::Expected<llvm::DWARFDebugNames::Entry>::getStorage() [T = llvm::DWARFDebugNames::Entry]"
                   );
    }
    DWARFDebugNames::Entry::dump((Entry *)local_178,W);
    DelimitedScope<'{',_'}'>::~DelimitedScope((DelimitedScope<___,____> *)&local_38);
    goto LAB_00d4b93d;
  }
  local_178[0] = '\0';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  _Var7._M_p = (pointer)((ulong)auVar2 & 0xfffffffffffffffe);
  EntryId = (uint64_t)W;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_38 = (Child)0x1;
  }
  else {
    cVar4 = (**(code **)(*(size_type *)_Var7._M_p + 0x30))(_Var7._M_p);
    if (cVar4 == '\0') {
      local_90._M_dataplus._M_p = _Var7._M_p;
      handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
                ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &local_38,(anon_class_1_0_00000001 *)&local_90,(anon_class_8_1_54a397f7 *)&EntryId)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00d4b858;
      sVar5 = *(size_type *)local_90._M_dataplus._M_p;
      _Var7._M_p = local_90._M_dataplus._M_p;
    }
    else {
      local_38 = (Child)0x1;
      puVar9 = *(undefined8 **)((long)_Var7._M_p + 8);
      puVar1 = *(undefined8 **)((long)_Var7._M_p + 0x10);
      CVar8 = local_38;
      if (puVar9 != puVar1) {
        CVar8 = (Child)0x1;
        local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var7._M_p;
        do {
          local_70.twine = (Twine *)*puVar9;
          *puVar9 = 0;
          local_58 = CVar8;
          handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
                    ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &local_a8,(anon_class_1_0_00000001 *)&local_70.character,
                     (anon_class_8_1_54a397f7 *)&EntryId);
          ErrorList::join((ErrorList *)&local_90,(Error *)&local_58,&local_a8);
          _Var7._M_p = local_90._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)0x0;
          plVar6 = (long *)(CONCAT44(local_a8.Payload._4_4_,local_a8.Payload._0_4_) &
                           0xfffffffffffffffe);
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 8))();
          }
          if (local_70.twine != (Twine *)0x0) {
            (**(code **)(*local_70.decUL + 8))();
          }
          local_70.twine = (Twine *)0x0;
          if ((local_58.decL & 0xfffffffffffffffeU) != (long *)0x0) {
            (**(code **)(*(local_58.decL & 0xfffffffffffffffeU) + 8))();
          }
          CVar8.twine = (Twine *)((ulong)_Var7._M_p | 1);
          puVar9 = puVar9 + 1;
          _Var7._M_p = (pointer)local_40;
        } while (puVar9 != puVar1);
      }
      local_38 = CVar8;
      sVar5 = *(size_type *)_Var7._M_p;
    }
    (**(code **)(sVar5 + 8))(_Var7._M_p);
  }
LAB_00d4b858:
  cantFail((Error *)&local_38,(char *)0x0);
  if ((local_38.decL & 0xfffffffffffffffeU) != (long *)0x0) {
    (**(code **)(*(local_38.decL & 0xfffffffffffffffeU) + 8))();
  }
LAB_00d4b93d:
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    local_178 = (undefined1  [8])&PTR___cxa_pure_virtual_01077f88;
    if (EntryOr.field_0.ErrorStorage.buffer !=
        (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
         )((long)&EntryOr.field_0 + 0x10)) {
      free((void *)EntryOr.field_0.ErrorStorage.buffer);
    }
  }
  else if ((char  [8])local_178 != (char  [8])0x0) {
    (**(code **)(*(long *)local_178 + 8))();
  }
  return (bool)(~uVar3 & 1);
}

Assistant:

bool DWARFDebugNames::NameIndex::dumpEntry(ScopedPrinter &W,
                                           uint64_t *Offset) const {
  uint64_t EntryId = *Offset;
  auto EntryOr = getEntry(Offset);
  if (!EntryOr) {
    handleAllErrors(EntryOr.takeError(), [](const SentinelError &) {},
                    [&W](const ErrorInfoBase &EI) { EI.log(W.startLine()); });
    return false;
  }

  DictScope EntryScope(W, ("Entry @ 0x" + Twine::utohexstr(EntryId)).str());
  EntryOr->dump(W);
  return true;
}